

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall
HVectorBase<HighsCDouble>::saxpy<HighsCDouble,double>
          (HVectorBase<HighsCDouble> *this,HighsCDouble pivotX,HVectorBase<double> *pivot)

{
  int iVar1;
  pointer pHVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  pointer pHVar7;
  ulong uVar8;
  uint uVar9;
  double extraout_XMM0_Qa;
  uint uVar10;
  double dVar11;
  HighsCDouble x1;
  HighsCDouble x0;
  HighsCDouble local_98;
  HighsCDouble local_88;
  HVectorBase<HighsCDouble> *local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  HighsCDouble local_50;
  HighsCDouble local_40;
  
  local_40.lo = pivotX.lo;
  local_40.hi = pivotX.hi;
  iVar6 = this->count;
  local_68 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  pHVar2 = (this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = (pivot->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_60 = (pivot->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar8 = (ulong)(uint)pivot->count;
  local_70 = this;
  if (pivot->count < 1) {
    uVar8 = uVar5;
  }
  for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = local_58[uVar5];
    pHVar7 = pHVar2 + iVar1;
    local_88.hi = pHVar7->hi;
    local_88.lo = pHVar7->lo;
    local_50 = HighsCDouble::operator*(&local_40,local_60[iVar1]);
    local_98 = HighsCDouble::operator+(&local_88,&local_50);
    dVar11 = local_98.lo;
    if ((local_88.hi + local_88.lo == 0.0) && (!NAN(local_88.hi + local_88.lo))) {
      lVar4 = (long)iVar6;
      iVar6 = iVar6 + 1;
      local_68[lVar4] = iVar1;
    }
    pHVar7 = pHVar2 + iVar1;
    abs((int)&local_98);
    uVar3 = (uint)(dVar11 + extraout_XMM0_Qa < 1e-14);
    uVar9 = (int)(uVar3 << 0x1f) >> 0x1f;
    uVar10 = (int)(uVar3 << 0x1f) >> 0x1f;
    *(uint *)&pHVar7->hi = ~uVar9 & local_98.hi._0_4_ | uVar9 & 0x4ad4b81f;
    *(uint *)((long)&pHVar7->hi + 4) = ~uVar10 & local_98.hi._4_4_ | uVar10 & 0x358dee7a;
    *(uint *)&pHVar7->lo = ~((int)(uVar3 << 0x1f) >> 0x1f) & local_98.lo._0_4_;
    *(uint *)((long)&pHVar7->lo + 4) = ~((int)(uVar3 << 0x1f) >> 0x1f) & local_98.lo._4_4_;
  }
  local_70->count = iVar6;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}